

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void load_weight_w8(int height,__m128i *weight_h,__m128i *weight_w)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ushort *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  __m128i zero;
  byte local_268;
  byte bStack_267;
  byte bStack_266;
  byte bStack_265;
  byte bStack_264;
  byte bStack_263;
  byte bStack_262;
  byte bStack_261;
  undefined1 local_248;
  undefined1 uStack_247;
  undefined1 uStack_246;
  undefined1 uStack_245;
  undefined1 uStack_244;
  undefined1 uStack_243;
  undefined1 uStack_242;
  undefined1 uStack_241;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  ushort local_88;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  ushort uStack_78;
  ushort uStack_76;
  ushort uStack_74;
  ushort uStack_72;
  __m128i weight_hi;
  __m128i weight_lo;
  __m128i tmp2;
  __m128i tmp1;
  __m128i d;
  __m128i we;
  ushort uStack_e;
  ushort uStack_c;
  ushort uStack_a;
  int we_offset;
  
  uVar1 = *(undefined8 *)*(undefined1 (*) [16])(smooth_weights + (int)((uint)(7 < in_EDI) << 2));
  auVar3 = *(undefined1 (*) [16])(smooth_weights + (int)((uint)(7 < in_EDI) << 2));
  local_248 = (undefined1)uVar1;
  uStack_247 = (undefined1)((ulong)uVar1 >> 8);
  uStack_246 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_245 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_244 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_243 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_242 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_241 = (undefined1)((ulong)uVar1 >> 0x38);
  *(undefined1 *)in_RSI = local_248;
  *(undefined1 *)((long)in_RSI + 1) = 0;
  *(undefined1 *)((long)in_RSI + 2) = uStack_247;
  *(undefined1 *)((long)in_RSI + 3) = 0;
  *(undefined1 *)((long)in_RSI + 4) = uStack_246;
  *(undefined1 *)((long)in_RSI + 5) = 0;
  *(undefined1 *)((long)in_RSI + 6) = uStack_245;
  *(undefined1 *)((long)in_RSI + 7) = 0;
  *(undefined1 *)(in_RSI + 1) = uStack_244;
  *(undefined1 *)((long)in_RSI + 9) = 0;
  *(undefined1 *)((long)in_RSI + 10) = uStack_243;
  *(undefined1 *)((long)in_RSI + 0xb) = 0;
  *(undefined1 *)((long)in_RSI + 0xc) = uStack_242;
  *(undefined1 *)((long)in_RSI + 0xd) = 0;
  *(undefined1 *)((long)in_RSI + 0xe) = uStack_241;
  *(undefined1 *)((long)in_RSI + 0xf) = 0;
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  local_e8 = (short)uVar1;
  sStack_e6 = (short)((ulong)uVar1 >> 0x10);
  sStack_e4 = (short)((ulong)uVar1 >> 0x20);
  sStack_e2 = (short)((ulong)uVar1 >> 0x30);
  sStack_e0 = (short)uVar2;
  sStack_de = (short)((ulong)uVar2 >> 0x10);
  sStack_dc = (short)((ulong)uVar2 >> 0x20);
  sStack_da = (short)((ulong)uVar2 >> 0x30);
  *(short *)(in_RSI + 2) = 0x100 - local_e8;
  *(short *)((long)in_RSI + 0x12) = 0x100 - sStack_e6;
  *(short *)((long)in_RSI + 0x14) = 0x100 - sStack_e4;
  *(short *)((long)in_RSI + 0x16) = 0x100 - sStack_e2;
  *(short *)(in_RSI + 3) = 0x100 - sStack_e0;
  *(short *)((long)in_RSI + 0x1a) = 0x100 - sStack_de;
  *(short *)((long)in_RSI + 0x1c) = 0x100 - sStack_dc;
  *(short *)((long)in_RSI + 0x1e) = 0x100 - sStack_da;
  if (in_EDI == 4) {
    local_268 = auVar3[4];
    bStack_267 = auVar3[5];
    bStack_266 = auVar3[6];
    bStack_265 = auVar3[7];
    bStack_264 = auVar3[8];
    bStack_263 = auVar3[9];
    bStack_262 = auVar3[10];
    bStack_261 = auVar3[0xb];
    uStack_106 = (ushort)bStack_267;
    uStack_104 = (ushort)bStack_266;
    uStack_102 = (ushort)bStack_265;
    uStack_fe = (ushort)bStack_263;
    uStack_fc = (ushort)bStack_262;
    uStack_fa = (ushort)bStack_261;
    weight_lo[1]._3_1_ = 0;
    weight_lo[1]._2_1_ = bStack_267;
    weight_lo[1]._5_1_ = 0;
    weight_lo[1]._4_1_ = bStack_266;
    weight_lo[1]._7_1_ = 0;
    weight_lo[1]._6_1_ = bStack_265;
    *in_RDX = (ushort)local_268;
    in_RDX[1] = 0x100 - local_268;
    in_RDX[2] = weight_lo[1]._2_2_;
    in_RDX[3] = 0x100 - uStack_106;
    in_RDX[4] = weight_lo[1]._4_2_;
    in_RDX[5] = 0x100 - uStack_104;
    in_RDX[6] = weight_lo[1]._6_2_;
    in_RDX[7] = 0x100 - uStack_102;
    uStack_e = (ushort)bStack_263;
    uStack_c = (ushort)bStack_262;
    uStack_a = (ushort)bStack_261;
    in_RDX[8] = (ushort)bStack_264;
    in_RDX[9] = 0x100 - bStack_264;
    in_RDX[10] = uStack_e;
    in_RDX[0xb] = 0x100 - uStack_fe;
    in_RDX[0xc] = uStack_c;
    in_RDX[0xd] = 0x100 - uStack_fc;
    in_RDX[0xe] = uStack_a;
    in_RDX[0xf] = 0x100 - uStack_fa;
  }
  else {
    uVar1 = *in_RSI;
    uVar2 = in_RSI[2];
    uStack_78 = (ushort)uVar1;
    uStack_76 = (ushort)((ulong)uVar1 >> 0x10);
    uStack_74 = (ushort)((ulong)uVar1 >> 0x20);
    uStack_72 = (ushort)((ulong)uVar1 >> 0x30);
    local_88 = (ushort)uVar2;
    uStack_86 = (ushort)((ulong)uVar2 >> 0x10);
    uStack_84 = (ushort)((ulong)uVar2 >> 0x20);
    uStack_82 = (ushort)((ulong)uVar2 >> 0x30);
    *in_RDX = uStack_78;
    in_RDX[1] = local_88;
    in_RDX[2] = uStack_76;
    in_RDX[3] = uStack_86;
    in_RDX[4] = uStack_74;
    in_RDX[5] = uStack_84;
    in_RDX[6] = uStack_72;
    in_RDX[7] = uStack_82;
    uVar1 = in_RSI[1];
    uVar2 = in_RSI[3];
    d[0]._0_2_ = (ushort)uVar1;
    d[0]._2_2_ = (ushort)((ulong)uVar1 >> 0x10);
    d[0]._4_2_ = (ushort)((ulong)uVar1 >> 0x20);
    d[0]._6_2_ = (ushort)((ulong)uVar1 >> 0x30);
    tmp1[0]._0_2_ = (ushort)uVar2;
    tmp1[0]._2_2_ = (ushort)((ulong)uVar2 >> 0x10);
    tmp1[0]._4_2_ = (ushort)((ulong)uVar2 >> 0x20);
    tmp1[0]._6_2_ = (ushort)((ulong)uVar2 >> 0x30);
    in_RDX[8] = (ushort)d[0];
    in_RDX[9] = (ushort)tmp1[0];
    in_RDX[10] = d[0]._2_2_;
    in_RDX[0xb] = tmp1[0]._2_2_;
    in_RDX[0xc] = d[0]._4_2_;
    in_RDX[0xd] = tmp1[0]._4_2_;
    in_RDX[0xe] = d[0]._6_2_;
    in_RDX[0xf] = tmp1[0]._6_2_;
  }
  if (in_EDI == 0x10) {
    *(undefined1 *)in_RSI = 0xff;
    *(undefined1 *)((long)in_RSI + 1) = 0;
    *(undefined1 *)((long)in_RSI + 2) = 0xe1;
    *(undefined1 *)((long)in_RSI + 3) = 0;
    *(undefined1 *)((long)in_RSI + 4) = 0xc4;
    *(undefined1 *)((long)in_RSI + 5) = 0;
    *(undefined1 *)((long)in_RSI + 6) = 0xaa;
    *(undefined1 *)((long)in_RSI + 7) = 0;
    *(undefined1 *)(in_RSI + 1) = 0x91;
    *(undefined1 *)((long)in_RSI + 9) = 0;
    *(undefined1 *)((long)in_RSI + 10) = 0x7b;
    *(undefined1 *)((long)in_RSI + 0xb) = 0;
    *(undefined1 *)((long)in_RSI + 0xc) = 0x66;
    *(undefined1 *)((long)in_RSI + 0xd) = 0;
    *(undefined1 *)((long)in_RSI + 0xe) = 0x54;
    *(undefined1 *)((long)in_RSI + 0xf) = 0;
    uVar1 = *in_RSI;
    uVar2 = in_RSI[1];
    local_128 = (short)uVar1;
    sStack_126 = (short)((ulong)uVar1 >> 0x10);
    sStack_124 = (short)((ulong)uVar1 >> 0x20);
    sStack_122 = (short)((ulong)uVar1 >> 0x30);
    sStack_120 = (short)uVar2;
    sStack_11e = (short)((ulong)uVar2 >> 0x10);
    sStack_11c = (short)((ulong)uVar2 >> 0x20);
    sStack_11a = (short)((ulong)uVar2 >> 0x30);
    *(short *)(in_RSI + 2) = 0x100 - local_128;
    *(short *)((long)in_RSI + 0x12) = 0x100 - sStack_126;
    *(short *)((long)in_RSI + 0x14) = 0x100 - sStack_124;
    *(short *)((long)in_RSI + 0x16) = 0x100 - sStack_122;
    *(short *)(in_RSI + 3) = 0x100 - sStack_120;
    *(short *)((long)in_RSI + 0x1a) = 0x100 - sStack_11e;
    *(short *)((long)in_RSI + 0x1c) = 0x100 - sStack_11c;
    *(short *)((long)in_RSI + 0x1e) = 0x100 - sStack_11a;
    *(undefined1 *)(in_RSI + 4) = 0x44;
    *(undefined1 *)((long)in_RSI + 0x21) = 0;
    *(undefined1 *)((long)in_RSI + 0x22) = 0x36;
    *(undefined1 *)((long)in_RSI + 0x23) = 0;
    *(undefined1 *)((long)in_RSI + 0x24) = 0x2b;
    *(undefined1 *)((long)in_RSI + 0x25) = 0;
    *(undefined1 *)((long)in_RSI + 0x26) = 0x21;
    *(undefined1 *)((long)in_RSI + 0x27) = 0;
    *(undefined1 *)(in_RSI + 5) = 0x1a;
    *(undefined1 *)((long)in_RSI + 0x29) = 0;
    *(undefined1 *)((long)in_RSI + 0x2a) = 0x14;
    *(undefined1 *)((long)in_RSI + 0x2b) = 0;
    *(undefined1 *)((long)in_RSI + 0x2c) = 0x11;
    *(undefined1 *)((long)in_RSI + 0x2d) = 0;
    *(undefined1 *)((long)in_RSI + 0x2e) = 0x10;
    *(undefined1 *)((long)in_RSI + 0x2f) = 0;
    uVar1 = in_RSI[4];
    uVar2 = in_RSI[5];
    local_148 = (short)uVar1;
    sStack_146 = (short)((ulong)uVar1 >> 0x10);
    sStack_144 = (short)((ulong)uVar1 >> 0x20);
    sStack_142 = (short)((ulong)uVar1 >> 0x30);
    sStack_140 = (short)uVar2;
    sStack_13e = (short)((ulong)uVar2 >> 0x10);
    sStack_13c = (short)((ulong)uVar2 >> 0x20);
    sStack_13a = (short)((ulong)uVar2 >> 0x30);
    *(short *)(in_RSI + 6) = 0x100 - local_148;
    *(short *)((long)in_RSI + 0x32) = 0x100 - sStack_146;
    *(short *)((long)in_RSI + 0x34) = 0x100 - sStack_144;
    *(short *)((long)in_RSI + 0x36) = 0x100 - sStack_142;
    *(short *)(in_RSI + 7) = 0x100 - sStack_140;
    *(short *)((long)in_RSI + 0x3a) = 0x100 - sStack_13e;
    *(short *)((long)in_RSI + 0x3c) = 0x100 - sStack_13c;
    *(short *)((long)in_RSI + 0x3e) = 0x100 - sStack_13a;
  }
  else if (in_EDI == 0x20) {
    *(undefined1 *)in_RSI = 0xff;
    *(undefined1 *)((long)in_RSI + 1) = 0;
    *(undefined1 *)((long)in_RSI + 2) = 0xf0;
    *(undefined1 *)((long)in_RSI + 3) = 0;
    *(undefined1 *)((long)in_RSI + 4) = 0xe1;
    *(undefined1 *)((long)in_RSI + 5) = 0;
    *(undefined1 *)((long)in_RSI + 6) = 0xd2;
    *(undefined1 *)((long)in_RSI + 7) = 0;
    *(undefined1 *)(in_RSI + 1) = 0xc4;
    *(undefined1 *)((long)in_RSI + 9) = 0;
    *(undefined1 *)((long)in_RSI + 10) = 0xb6;
    *(undefined1 *)((long)in_RSI + 0xb) = 0;
    *(undefined1 *)((long)in_RSI + 0xc) = 0xa9;
    *(undefined1 *)((long)in_RSI + 0xd) = 0;
    *(undefined1 *)((long)in_RSI + 0xe) = 0x9d;
    *(undefined1 *)((long)in_RSI + 0xf) = 0;
    uVar1 = *in_RSI;
    uVar2 = in_RSI[1];
    local_168 = (short)uVar1;
    sStack_166 = (short)((ulong)uVar1 >> 0x10);
    sStack_164 = (short)((ulong)uVar1 >> 0x20);
    sStack_162 = (short)((ulong)uVar1 >> 0x30);
    sStack_160 = (short)uVar2;
    sStack_15e = (short)((ulong)uVar2 >> 0x10);
    sStack_15c = (short)((ulong)uVar2 >> 0x20);
    sStack_15a = (short)((ulong)uVar2 >> 0x30);
    *(short *)(in_RSI + 2) = 0x100 - local_168;
    *(short *)((long)in_RSI + 0x12) = 0x100 - sStack_166;
    *(short *)((long)in_RSI + 0x14) = 0x100 - sStack_164;
    *(short *)((long)in_RSI + 0x16) = 0x100 - sStack_162;
    *(short *)(in_RSI + 3) = 0x100 - sStack_160;
    *(short *)((long)in_RSI + 0x1a) = 0x100 - sStack_15e;
    *(short *)((long)in_RSI + 0x1c) = 0x100 - sStack_15c;
    *(short *)((long)in_RSI + 0x1e) = 0x100 - sStack_15a;
    *(undefined1 *)(in_RSI + 4) = 0x91;
    *(undefined1 *)((long)in_RSI + 0x21) = 0;
    *(undefined1 *)((long)in_RSI + 0x22) = 0x85;
    *(undefined1 *)((long)in_RSI + 0x23) = 0;
    *(undefined1 *)((long)in_RSI + 0x24) = 0x7a;
    *(undefined1 *)((long)in_RSI + 0x25) = 0;
    *(undefined1 *)((long)in_RSI + 0x26) = 0x6f;
    *(undefined1 *)((long)in_RSI + 0x27) = 0;
    *(undefined1 *)(in_RSI + 5) = 0x65;
    *(undefined1 *)((long)in_RSI + 0x29) = 0;
    *(undefined1 *)((long)in_RSI + 0x2a) = 0x5c;
    *(undefined1 *)((long)in_RSI + 0x2b) = 0;
    *(undefined1 *)((long)in_RSI + 0x2c) = 0x53;
    *(undefined1 *)((long)in_RSI + 0x2d) = 0;
    *(undefined1 *)((long)in_RSI + 0x2e) = 0x4a;
    *(undefined1 *)((long)in_RSI + 0x2f) = 0;
    uVar1 = in_RSI[4];
    uVar2 = in_RSI[5];
    local_188 = (short)uVar1;
    sStack_186 = (short)((ulong)uVar1 >> 0x10);
    sStack_184 = (short)((ulong)uVar1 >> 0x20);
    sStack_182 = (short)((ulong)uVar1 >> 0x30);
    sStack_180 = (short)uVar2;
    sStack_17e = (short)((ulong)uVar2 >> 0x10);
    sStack_17c = (short)((ulong)uVar2 >> 0x20);
    sStack_17a = (short)((ulong)uVar2 >> 0x30);
    *(short *)(in_RSI + 6) = 0x100 - local_188;
    *(short *)((long)in_RSI + 0x32) = 0x100 - sStack_186;
    *(short *)((long)in_RSI + 0x34) = 0x100 - sStack_184;
    *(short *)((long)in_RSI + 0x36) = 0x100 - sStack_182;
    *(short *)(in_RSI + 7) = 0x100 - sStack_180;
    *(short *)((long)in_RSI + 0x3a) = 0x100 - sStack_17e;
    *(short *)((long)in_RSI + 0x3c) = 0x100 - sStack_17c;
    *(short *)((long)in_RSI + 0x3e) = 0x100 - sStack_17a;
    *(undefined1 *)(in_RSI + 8) = 0x42;
    *(undefined1 *)((long)in_RSI + 0x41) = 0;
    *(undefined1 *)((long)in_RSI + 0x42) = 0x3b;
    *(undefined1 *)((long)in_RSI + 0x43) = 0;
    *(undefined1 *)((long)in_RSI + 0x44) = 0x34;
    *(undefined1 *)((long)in_RSI + 0x45) = 0;
    *(undefined1 *)((long)in_RSI + 0x46) = 0x2d;
    *(undefined1 *)((long)in_RSI + 0x47) = 0;
    *(undefined1 *)(in_RSI + 9) = 0x27;
    *(undefined1 *)((long)in_RSI + 0x49) = 0;
    *(undefined1 *)((long)in_RSI + 0x4a) = 0x22;
    *(undefined1 *)((long)in_RSI + 0x4b) = 0;
    *(undefined1 *)((long)in_RSI + 0x4c) = 0x1d;
    *(undefined1 *)((long)in_RSI + 0x4d) = 0;
    *(undefined1 *)((long)in_RSI + 0x4e) = 0x19;
    *(undefined1 *)((long)in_RSI + 0x4f) = 0;
    uVar1 = in_RSI[8];
    uVar2 = in_RSI[9];
    local_1a8 = (short)uVar1;
    sStack_1a6 = (short)((ulong)uVar1 >> 0x10);
    sStack_1a4 = (short)((ulong)uVar1 >> 0x20);
    sStack_1a2 = (short)((ulong)uVar1 >> 0x30);
    sStack_1a0 = (short)uVar2;
    sStack_19e = (short)((ulong)uVar2 >> 0x10);
    sStack_19c = (short)((ulong)uVar2 >> 0x20);
    sStack_19a = (short)((ulong)uVar2 >> 0x30);
    *(short *)(in_RSI + 10) = 0x100 - local_1a8;
    *(short *)((long)in_RSI + 0x52) = 0x100 - sStack_1a6;
    *(short *)((long)in_RSI + 0x54) = 0x100 - sStack_1a4;
    *(short *)((long)in_RSI + 0x56) = 0x100 - sStack_1a2;
    *(short *)(in_RSI + 0xb) = 0x100 - sStack_1a0;
    *(short *)((long)in_RSI + 0x5a) = 0x100 - sStack_19e;
    *(short *)((long)in_RSI + 0x5c) = 0x100 - sStack_19c;
    *(short *)((long)in_RSI + 0x5e) = 0x100 - sStack_19a;
    *(undefined1 *)(in_RSI + 0xc) = 0x15;
    *(undefined1 *)((long)in_RSI + 0x61) = 0;
    *(undefined1 *)((long)in_RSI + 0x62) = 0x11;
    *(undefined1 *)((long)in_RSI + 99) = 0;
    *(undefined1 *)((long)in_RSI + 100) = 0xe;
    *(undefined1 *)((long)in_RSI + 0x65) = 0;
    *(undefined1 *)((long)in_RSI + 0x66) = 0xc;
    *(undefined1 *)((long)in_RSI + 0x67) = 0;
    *(undefined1 *)(in_RSI + 0xd) = 10;
    *(undefined1 *)((long)in_RSI + 0x69) = 0;
    *(undefined1 *)((long)in_RSI + 0x6a) = 9;
    *(undefined1 *)((long)in_RSI + 0x6b) = 0;
    *(undefined1 *)((long)in_RSI + 0x6c) = 8;
    *(undefined1 *)((long)in_RSI + 0x6d) = 0;
    *(undefined1 *)((long)in_RSI + 0x6e) = 8;
    *(undefined1 *)((long)in_RSI + 0x6f) = 0;
    uVar1 = in_RSI[0xc];
    uVar2 = in_RSI[0xd];
    local_1c8 = (short)uVar1;
    sStack_1c6 = (short)((ulong)uVar1 >> 0x10);
    sStack_1c4 = (short)((ulong)uVar1 >> 0x20);
    sStack_1c2 = (short)((ulong)uVar1 >> 0x30);
    sStack_1c0 = (short)uVar2;
    sStack_1be = (short)((ulong)uVar2 >> 0x10);
    sStack_1bc = (short)((ulong)uVar2 >> 0x20);
    sStack_1ba = (short)((ulong)uVar2 >> 0x30);
    *(short *)(in_RSI + 0xe) = 0x100 - local_1c8;
    *(short *)((long)in_RSI + 0x72) = 0x100 - sStack_1c6;
    *(short *)((long)in_RSI + 0x74) = 0x100 - sStack_1c4;
    *(short *)((long)in_RSI + 0x76) = 0x100 - sStack_1c2;
    *(short *)(in_RSI + 0xf) = 0x100 - sStack_1c0;
    *(short *)((long)in_RSI + 0x7a) = 0x100 - sStack_1be;
    *(short *)((long)in_RSI + 0x7c) = 0x100 - sStack_1bc;
    *(short *)((long)in_RSI + 0x7e) = 0x100 - sStack_1ba;
  }
  return;
}

Assistant:

static inline void load_weight_w8(int height, __m128i *weight_h,
                                  __m128i *weight_w) {
  const __m128i zero = _mm_setzero_si128();
  const int we_offset = height < 8 ? 0 : 4;
  __m128i we = _mm_loadu_si128((const __m128i *)&smooth_weights[we_offset]);
  weight_h[0] = _mm_unpacklo_epi8(we, zero);
  const __m128i d = _mm_set1_epi16((int16_t)(1 << SMOOTH_WEIGHT_LOG2_SCALE));
  weight_h[1] = _mm_sub_epi16(d, weight_h[0]);

  if (height == 4) {
    we = _mm_srli_si128(we, 4);
    __m128i tmp1 = _mm_unpacklo_epi8(we, zero);
    __m128i tmp2 = _mm_sub_epi16(d, tmp1);
    weight_w[0] = _mm_unpacklo_epi16(tmp1, tmp2);
    weight_w[1] = _mm_unpackhi_epi16(tmp1, tmp2);
  } else {
    weight_w[0] = _mm_unpacklo_epi16(weight_h[0], weight_h[1]);
    weight_w[1] = _mm_unpackhi_epi16(weight_h[0], weight_h[1]);
  }

  if (height == 16) {
    we = _mm_loadu_si128((const __m128i *)&smooth_weights[12]);
    weight_h[0] = _mm_unpacklo_epi8(we, zero);
    weight_h[1] = _mm_sub_epi16(d, weight_h[0]);
    weight_h[2] = _mm_unpackhi_epi8(we, zero);
    weight_h[3] = _mm_sub_epi16(d, weight_h[2]);
  } else if (height == 32) {
    const __m128i weight_lo =
        _mm_loadu_si128((const __m128i *)&smooth_weights[28]);
    weight_h[0] = _mm_unpacklo_epi8(weight_lo, zero);
    weight_h[1] = _mm_sub_epi16(d, weight_h[0]);
    weight_h[2] = _mm_unpackhi_epi8(weight_lo, zero);
    weight_h[3] = _mm_sub_epi16(d, weight_h[2]);
    const __m128i weight_hi =
        _mm_loadu_si128((const __m128i *)&smooth_weights[28 + 16]);
    weight_h[4] = _mm_unpacklo_epi8(weight_hi, zero);
    weight_h[5] = _mm_sub_epi16(d, weight_h[4]);
    weight_h[6] = _mm_unpackhi_epi8(weight_hi, zero);
    weight_h[7] = _mm_sub_epi16(d, weight_h[6]);
  }
}